

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void __thiscall
xLearn::CSVParser::Parse(CSVParser *this,char *buf,uint64 size,DMatrix *matrix,bool reset)

{
  undefined1 auVar1 [16];
  int iVar2;
  index_t field_id;
  ostream *poVar3;
  DMatrix *this_00;
  size_type sVar4;
  char *pcVar5;
  reference pvVar6;
  long in_RCX;
  ulong in_RDX;
  long in_RSI;
  byte in_R8B;
  double dVar7;
  real_t value;
  index_t idx;
  int j;
  real_t norm;
  int size_1;
  int i;
  uint64 rd_size;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str_vec;
  uint64 pos;
  Logger *in_stack_fffffffffffffdf0;
  DMatrix *in_stack_fffffffffffffe30;
  string *in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  allocator *paVar8;
  string *in_stack_fffffffffffffe68;
  string *file;
  uint64 in_stack_fffffffffffffe70;
  LogSeverity LVar9;
  char *in_stack_fffffffffffffe78;
  char *in_stack_fffffffffffffe80;
  Parser *in_stack_fffffffffffffe88;
  int local_138;
  float local_134;
  real_t in_stack_fffffffffffffed4;
  index_t in_stack_fffffffffffffed8;
  index_t in_stack_fffffffffffffedc;
  DMatrix *in_stack_fffffffffffffee0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  long local_e0;
  allocator local_d1;
  string local_d0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffff60;
  Logger local_88;
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  Logger local_28;
  byte local_21;
  long local_20;
  ulong local_18;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffe60 >> 0x20);
  local_21 = in_R8B & 1;
  if (in_RSI == 0) {
    Logger::Logger(&local_28,ERR);
    LVar9 = (LogSeverity)(in_stack_fffffffffffffe70 >> 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/parser.cc"
               ,&local_49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"Parse",&local_81);
    poVar3 = Logger::Start(LVar9,in_stack_fffffffffffffe68,iVar2,in_stack_fffffffffffffe58);
    poVar3 = std::operator<<(poVar3,"CHECK failed ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/parser.cc"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xcf);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"buf");
    std::operator<<(poVar3," == NULL \n");
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    Logger::~Logger(in_stack_fffffffffffffdf0);
    abort();
  }
  if (in_RDX == 0) {
    local_18 = in_RDX;
    Logger::Logger(&local_88,ERR);
    LVar9 = (LogSeverity)(in_stack_fffffffffffffe70 >> 0x20);
    file = (string *)&stack0xffffffffffffff57;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff58,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/parser.cc"
               ,(allocator *)file);
    paVar8 = &local_d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"Parse",paVar8);
    poVar3 = Logger::Start(LVar9,file,(int)((ulong)paVar8 >> 0x20),in_stack_fffffffffffffe58);
    poVar3 = std::operator<<(poVar3,"CHECK_GT failed ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/parser.cc"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xd0);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"size");
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_18);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"0");
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff57);
    Logger::~Logger(in_stack_fffffffffffffdf0);
    abort();
  }
  local_20 = in_RCX;
  if (local_21 != 0) {
    DMatrix::Reset(in_stack_fffffffffffffe30);
  }
  local_e0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x20d7e3);
  while( true ) {
    this_00 = (DMatrix *)
              Parser::get_line_from_buffer
                        (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                         in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
                         (uint64)in_stack_fffffffffffffe68);
    if (this_00 == (DMatrix *)0x0) break;
    local_e0 = (long)&this_00->hash_value_1 + local_e0;
    DMatrix::AddRow(this_00);
    iVar2 = *(int *)(local_20 + 0x10) + -1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x20d897);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffed8,line_buf,(allocator *)&stack0xfffffffffffffed7);
    std::__cxx11::string::c_str();
    SplitStringUsing(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffed8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffed7);
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_f8);
    field_id = (index_t)sVar4;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_f8,0);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    dVar7 = atof(pcVar5);
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(local_20 + 0x30),(long)iVar2);
    *pvVar6 = (float)dVar7;
    local_134 = 0.0;
    for (local_138 = 1; local_138 < (int)field_id; local_138 = local_138 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_f8,(long)local_138);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      dVar7 = atof(pcVar5);
      DMatrix::AddNode(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed8
                       ,in_stack_fffffffffffffed4,field_id);
      auVar1 = vfmadd213ss_fma(ZEXT416((uint)(float)dVar7),ZEXT416((uint)(float)dVar7),
                               ZEXT416((uint)local_134));
      local_134 = auVar1._0_4_;
    }
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(local_20 + 0x48),(long)iVar2);
    *pvVar6 = 1.0 / local_134;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x0);
  return;
}

Assistant:

void CSVParser::Parse(char* buf, 
                      uint64 size, 
                      DMatrix& matrix, 
                      bool reset) {
  CHECK_NOTNULL(buf);
  CHECK_GT(size, 0);
  // Clear the data matrix
  if (reset) { 
    matrix.Reset(); 
  }
  // Parse every line
  uint64 pos = 0;
  std::vector<std::string> str_vec;
  for (;;) {
    uint64 rd_size = get_line_from_buffer(line_buf, buf, pos, size);
    if (rd_size == 0) break;
    pos += rd_size;
    matrix.AddRow();
    int i = matrix.row_length - 1;
    str_vec.clear();
    SplitStringUsing(line_buf, splitor_.c_str(), &str_vec);
    int size = str_vec.size();
    // Add Y
    matrix.Y[i] = atof(str_vec[0].c_str());
    // Add features
    real_t norm = 0.0;
    for (int j = 1; j < size; ++j) {
      index_t idx = j-1;
      real_t value = atof(str_vec[j].c_str());
      matrix.AddNode(i, idx, value);
      norm += value*value;
    }
    norm = 1.0f / norm;
    matrix.norm[i] = norm;
  }
}